

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O0

void __thiscall
ScriptOperator_operator_7_Test::~ScriptOperator_operator_7_Test
          (ScriptOperator_operator_7_Test *this)

{
  ScriptOperator_operator_7_Test *this_local;
  
  ~ScriptOperator_operator_7_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptOperator, operator_7) {
  ScriptOperator script_op(ScriptOperator::OP_3);
  EXPECT_FALSE(script_op >= ScriptOperator::OP_MIN);
  EXPECT_FALSE(script_op >= ScriptOperator::OP_10);
  EXPECT_TRUE(script_op >= ScriptOperator::OP_3);
  EXPECT_TRUE(script_op >= ScriptOperator::OP_0);
  EXPECT_TRUE(script_op >= ScriptOperator::OP_PUSHDATA4);
  EXPECT_TRUE(script_op.IsPushOperator());
}